

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Entry * __thiscall
kj::
Table<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_unsigned_short>::Callbacks>_>
::insert(Table<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_unsigned_short>::Callbacks>_>
         *this,Entry *row)

{
  Entry *pEVar1;
  Entry *pEVar2;
  RemoveConst<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry> *pRVar3;
  undefined6 uVar4;
  size_t sVar5;
  ArrayPtr<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry> table;
  HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks> local_28 [16];
  
  pEVar1 = (this->rows).builder.ptr;
  sVar5 = ((long)(this->rows).builder.pos - (long)pEVar1 >> 3) * -0x5555555555555555;
  table.size_ = (size_t)pEVar1;
  table.ptr = (Entry *)&this->indexes;
  HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks>::
  insert<kj::HashMap<kj::StringPtr,unsigned_short>::Entry,kj::StringPtr&>
            (local_28,table,sVar5,(StringPtr *)sVar5);
  if (local_28[0] != (HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks>)0x1) {
    pEVar1 = (this->rows).builder.endPtr;
    if ((this->rows).builder.pos == pEVar1) {
      pEVar2 = (this->rows).builder.ptr;
      sVar5 = 4;
      if (pEVar1 != pEVar2) {
        sVar5 = ((long)pEVar1 - (long)pEVar2 >> 3) * 0x5555555555555556;
      }
      Vector<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry>::setCapacity(&this->rows,sVar5);
    }
    pRVar3 = (this->rows).builder.pos;
    uVar4 = *(undefined6 *)&row->field_0x12;
    pRVar3->value = row->value;
    *(undefined6 *)&pRVar3->field_0x12 = uVar4;
    sVar5 = (row->key).content.size_;
    (pRVar3->key).content.ptr = (row->key).content.ptr;
    (pRVar3->key).content.size_ = sVar5;
    pEVar1 = (this->rows).builder.pos;
    (this->rows).builder.pos = pEVar1 + 1;
    return pEVar1;
  }
  kj::_::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  KJ_IF_MAYBE(existing, Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }